

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadSections(BinaryReader *this,ReadSectionsOptions *options)

{
  Result RVar1;
  BinarySectionOrder BVar2;
  BinarySectionOrder BVar3;
  int iVar4;
  Enum EVar5;
  ulong uVar6;
  BinarySection sec;
  BinarySection sec_00;
  ulong uVar7;
  char *format;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  uint8_t section_code;
  uint32_t value;
  bool seen_section_code [14];
  byte local_59;
  size_t local_58;
  uint local_4c;
  char acStack_48 [16];
  ReadSectionsOptions *local_38;
  
  EVar5 = Ok;
  acStack_48[8] = '\0';
  acStack_48[9] = '\0';
  acStack_48[10] = '\0';
  acStack_48[0xb] = '\0';
  acStack_48[0xc] = '\0';
  acStack_48[0xd] = '\0';
  acStack_48[0] = '\0';
  acStack_48[1] = '\0';
  acStack_48[2] = '\0';
  acStack_48[3] = '\0';
  acStack_48[4] = '\0';
  acStack_48[5] = '\0';
  acStack_48[6] = '\0';
  acStack_48[7] = '\0';
  if ((this->state_).offset < (this->state_).size) {
    uVar9 = 0;
    local_38 = options;
    do {
      RVar1 = ReadU8(this,&local_59,"section code");
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      RVar1 = ReadU32Leb128(this,&local_4c,"section size");
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      sVar10 = this->read_end_;
      uVar6 = (this->state_).offset + (ulong)local_4c;
      this->read_end_ = uVar6;
      uVar7 = (ulong)local_59;
      sec = (BinarySection)local_59;
      if (local_59 < 0xe) {
        if (uVar7 == 0) {
LAB_00123fed:
          if ((this->state_).size < uVar6) {
            pcVar8 = "invalid section size: extends past end";
          }
          else {
            sec_00 = (BinarySection)local_59;
            local_58 = sVar10;
            if ((sec_00 != Custom) && (this->last_known_section_ != Invalid)) {
              BVar2 = GetSectionOrder(sec_00);
              BVar3 = GetSectionOrder(this->last_known_section_);
              sVar10 = local_58;
              if ((int)BVar2 <= (int)BVar3) {
                pcVar8 = GetSectionName(sec_00);
                format = "section %s out of order";
                goto LAB_00124220;
              }
            }
            sVar10 = local_58;
            if ((uVar7 != 0) && (this->did_read_names_section_ != false)) {
              pcVar8 = GetSectionName(sec);
              format = "%s section can not occur after Name section";
              goto LAB_00124220;
            }
            iVar4 = (*this->delegate_->_vptr_BinaryReaderDelegate[6])
                              (this->delegate_,uVar9,(ulong)(uint)sec,(ulong)local_4c);
            if (iVar4 == 0) {
              EVar5 = (*(code *)(&DAT_00152d98 + *(int *)(&DAT_00152d98 + (ulong)(uint)sec * 4)))();
              return (Result)EVar5;
            }
            pcVar8 = "BeginSection callback failed";
          }
          PrintError(this,pcVar8);
        }
        else {
          if (acStack_48[uVar7] != '\x01') {
            acStack_48[uVar7] = '\x01';
            goto LAB_00123fed;
          }
          pcVar8 = GetSectionName((uint)local_59);
          format = "multiple %s sections";
LAB_00124220:
          PrintError(this,format,pcVar8);
        }
LAB_0012422d:
        this->read_end_ = sVar10;
        return (Result)Error;
      }
      PrintError(this,"invalid section code: %u",(ulong)(uint)sec);
      if (local_38->stop_on_first_error != false) goto LAB_0012422d;
      (this->state_).offset = this->read_end_;
      EVar5 = Error;
      this->read_end_ = sVar10;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while ((this->state_).offset < (this->state_).size);
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReader::ReadSections(const ReadSectionsOptions& options) {
  Result result = Result::Ok;
  Index section_index = 0;
  bool seen_section_code[static_cast<int>(BinarySection::Last) + 1] = {false};

  for (; state_.offset < state_.size; ++section_index) {
    uint8_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU8(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u", section_code);
      if (options.stop_on_first_error) {
        return Result::Error;
      }
      // If we don't have to stop on first error, continue reading
      // sections, because although we could not understand the
      // current section, we can continue and correctly parse
      // subsequent sections, so we can give back as much information
      // as we can understand.
      result = Result::Error;
      state_.offset = read_end_;
      continue;
    }

    BinarySection section = static_cast<BinarySection>(section_code);
    if (section != BinarySection::Custom) {
      if (seen_section_code[section_code]) {
        PrintError("multiple %s sections", GetSectionName(section));
        return Result::Error;
      }
      seen_section_code[section_code] = true;
    }

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(
        last_known_section_ == BinarySection::Invalid ||
            section == BinarySection::Custom ||
            GetSectionOrder(section) > GetSectionOrder(last_known_section_),
        "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section_index, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_index, section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Tag:
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadTagSection(section_size);
        result |= section_result;
        break;
      case BinarySection::DataCount:
        ERROR_UNLESS(options_.features.bulk_memory_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadDataCountSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Succeeded(section_result) && state_.offset != read_end_) {
      PrintError("unfinished section (expected end: 0x%" PRIzx ")", read_end_);
      section_result = Result::Error;
      result |= section_result;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }

    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}